

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedbackOverflowQueryErrorNoActiveQuery::deinit
          (TransformFeedbackOverflowQueryErrorNoActiveQuery *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  TransformFeedbackOverflowQueryErrorNoActiveQuery *this_local;
  
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQueryErrorBase).
                      super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (bVar1) {
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x630))(0x82ed,this->m_active_query_stream_index);
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x458))(1,&this->m_active_stream_overflow_query);
  }
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

virtual void deinit()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		if (supportsTransformFeedback3())
		{
			gl.endQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, m_active_query_stream_index);
			gl.deleteQueries(1, &m_active_stream_overflow_query);
		}

		TransformFeedbackOverflowQueryErrorBase::deinit();
	}